

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  ulong uVar1;
  LogMessage *other;
  Int64Vector *pIVar2;
  StringVector *pSVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/DictVectorizer.pb.cc"
               ,0x135);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_Map(this);
      this->_oneof_case_[0] = 1;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pSVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                         (pAVar5);
      (this->Map_).stringtoindex_ = pSVar3;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar4 = (undefined1 *)(from->Map_).stringtoindex_;
    }
    else {
      puVar4 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom((this->Map_).stringtoindex_,(StringVector *)puVar4);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_Map(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pIVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                         (pAVar5);
      (this->Map_).int64toindex_ = pIVar2;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar4 = (undefined1 *)(from->Map_).int64toindex_;
    }
    else {
      puVar4 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom((this->Map_).int64toindex_,(Int64Vector *)puVar4);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      _internal_mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      _internal_mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}